

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O2

qpdf_offset_t __thiscall BufferInputSource::findAndSkipNextEOL(BufferInputSource *this)

{
  uchar uVar1;
  long lVar2;
  uchar *puVar3;
  logic_error *this_00;
  long lVar4;
  long lVar5;
  
  if (this->cur_offset < 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"INTERNAL ERROR: BufferInputSource offset < 0");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  lVar2 = this->max_offset;
  if (this->cur_offset < lVar2) {
    puVar3 = Buffer::getBuffer(this->buf);
    for (lVar4 = this->cur_offset; puVar3 + lVar4 < puVar3 + lVar2; lVar4 = lVar4 + 1) {
      uVar1 = puVar3[lVar4];
      lVar5 = lVar4;
      if ((uVar1 == '\n') || (uVar1 == '\r')) {
        do {
          lVar5 = lVar5 + 1;
          this->cur_offset = lVar5;
          if (lVar2 <= lVar5) {
            return lVar4;
          }
        } while ((puVar3[lVar5] == '\r') || (puVar3[lVar5] == '\n'));
        return lVar4;
      }
    }
  }
  else {
    (this->super_InputSource).last_offset = lVar2;
  }
  this->cur_offset = lVar2;
  return lVar2;
}

Assistant:

qpdf_offset_t
BufferInputSource::findAndSkipNextEOL()
{
    if (this->cur_offset < 0) {
        throw std::logic_error("INTERNAL ERROR: BufferInputSource offset < 0");
    }
    qpdf_offset_t end_pos = this->max_offset;
    if (this->cur_offset >= end_pos) {
        this->last_offset = end_pos;
        this->cur_offset = end_pos;
        return end_pos;
    }

    qpdf_offset_t result = 0;
    unsigned char const* buffer = this->buf->getBuffer();
    unsigned char const* end = buffer + end_pos;
    unsigned char const* p = buffer + this->cur_offset;

    while ((p < end) && !((*p == '\r') || (*p == '\n'))) {
        ++p;
    }
    if (p < end) {
        result = p - buffer;
        this->cur_offset = result + 1;
        ++p;
        while ((this->cur_offset < end_pos) && ((*p == '\r') || (*p == '\n'))) {
            ++p;
            ++this->cur_offset;
        }
    } else {
        this->cur_offset = end_pos;
        result = end_pos;
    }
    return result;
}